

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulnerabilitytocsv.cpp
# Opt level: O2

void printrows(int vulnerability_id,FILE *finx,longlong size)

{
  long lVar1;
  VulnerabilityRow row;
  
  for (lVar1 = 0; lVar1 < size; lVar1 = lVar1 + 0xc) {
    fread(&row,0xc,1,(FILE *)finx);
    printf("%d, %d, %d, %.10e\n",(double)row.probability,vulnerability_id,
           (ulong)(uint)row.intensity_bin_id,(ulong)(uint)row.damage_bin_id);
  }
  return;
}

Assistant:

inline void printrows(int vulnerability_id, FILE *finx, long long size)
{

	long long i = 0;
	while (i < size) {
		VulnerabilityRow row;
		fread(&row, sizeof(row), 1, finx);
		printf("%d, %d, %d, %.10e\n", vulnerability_id,
		       row.intensity_bin_id, row.damage_bin_id,
		       row.probability);
		i += sizeof(row);
	}

}